

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>
          (DelayedEofInputStream *this,unsigned_long requested,Promise<unsigned_long> *innerPromise)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode node;
  void *pvVar3;
  PromiseNode *extraout_RAX;
  OwnPromiseNode *in_RCX;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  PromiseBase local_50;
  SourceLocation local_48;
  
  pPVar1 = in_RCX->ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x38) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3c8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,in_RCX,
               kj::_::
               TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6839:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6854:10)>
               ::anon_class_16_2_8ec82bdb_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3c8) = &PTR_destroy_006d9868;
    *(unsigned_long *)((long)pvVar3 + 1000) = requested;
    *(Promise<unsigned_long> **)((long)pvVar3 + 0x3f0) = innerPromise;
    *(unsigned_long *)((long)pvVar3 + 0x3f8) = requested;
    *(void **)((long)pvVar3 + 0x3d0) = pvVar3;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&pPVar1[-4].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,in_RCX,
               kj::_::
               TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6839:32),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6854:10)>
               ::anon_class_16_2_8ec82bdb_for_func::operator());
    pPVar1[-4].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006d9868;
    pPVar1[-2].super_PromiseArenaMember.arena = (PromiseArena *)requested;
    pPVar1[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)innerPromise;
    pPVar1[-1].super_PromiseArenaMember.arena = (PromiseArena *)requested;
    pPVar1[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_48.function = "wrap";
  local_48.lineNumber = 0x1ab7;
  local_48.columnNumber = 0xe;
  local_58.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,&local_48);
  node.ptr = local_58.ptr;
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)local_50.node.ptr;
  if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX;
  }
  return (Promise<unsigned_long>)local_50.node.ptr;
}

Assistant:

kj::Promise<T> wrap(T requested, kj::Promise<T> innerPromise) {
      return innerPromise.then([this,requested](T actual) -> kj::Promise<T> {
        if (actual < requested) {
          // Must have reached EOF.
          KJ_IF_SOME(t, completionTask) {
            // Delay until completion.
            auto result = t.then([actual]() { return actual; });
            completionTask = kj::none;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return actual;
          }
        } else {
          return actual;
        }
      }, [this](kj::Exception&& e) -> kj::Promise<T> {
        // The stream threw an exception, but this exception is almost certainly just complaining
        // that the other end of the stream was dropped. In all likelihood, the HttpService
        // request() call itself will throw a much more interesting error -- we'd rather propagate
        // that one, if so.
        KJ_IF_SOME(t, completionTask) {
          auto result = t.then([e = kj::mv(e)]() mutable -> kj::Promise<T> {
            // Looks like the service didn't throw. I guess we should propagate the stream error
            // after all.
            return kj::mv(e);
          });
          completionTask = kj::none;
          return result;
        } else {
          // Must have called tryRead() again after we already signaled EOF or threw. Fine.
          return kj::mv(e);
        }
      });
    }